

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  base_iterator bVar3;
  directory_iterator dVar4;
  embedded_filesystem fs;
  string local_80;
  _Rb_tree_node_base *local_60;
  long *local_58;
  long local_50;
  long local_48 [2];
  embedded_filesystem local_38;
  
  local_38 = cmrc::iterate::get_filesystem();
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  dVar4 = cmrc::embedded_filesystem::iterate_directory(&local_38,&local_80);
  bVar3 = dVar4._base_iter._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (bVar3._M_node != dVar4._end_iter._M_node._M_node) {
    do {
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)(bVar3._M_node + 1),
                 (long)&(bVar3._M_node[1]._M_parent)->_M_color + *(long *)(bVar3._M_node + 1));
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_58,local_50 + (long)local_58);
      local_60 = bVar3._M_node + 2;
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length)
      ;
      local_58 = (long *)CONCAT71(local_58._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_58,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      bVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(bVar3._M_node);
    } while (bVar3._M_node != dVar4._end_iter._M_node._M_node);
  }
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"subdir_a/subdir_b","");
  dVar4 = cmrc::embedded_filesystem::iterate_directory(&local_38,&local_80);
  bVar3 = dVar4._base_iter._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (bVar3._M_node != dVar4._end_iter._M_node._M_node) {
    do {
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)(bVar3._M_node + 1),
                 (long)&(bVar3._M_node[1]._M_parent)->_M_color + *(long *)(bVar3._M_node + 1));
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_58,local_50 + (long)local_58);
      local_60 = bVar3._M_node + 2;
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length)
      ;
      local_58 = (long *)CONCAT71(local_58._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_58,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      bVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(bVar3._M_node);
    } while (bVar3._M_node != dVar4._end_iter._M_node._M_node);
  }
  return 0;
}

Assistant:

int main() {
    auto fs = cmrc::iterate::get_filesystem();
    for (auto&& entry : fs.iterate_directory("")) {
        std::cout << entry.filename() << '\n';
    }
    for (auto&& entry : fs.iterate_directory("subdir_a/subdir_b")) {
        std::cout << entry.filename() << '\n';
    }
}